

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsDomainGetEntities
              (FmsDomain domain,FmsEntityType type,int **reordering,FmsIntType ent_id_type,
              FmsInt first_ent,void *ents,FmsInt num_ents)

{
  long lVar1;
  FmsInt in_stack_000001c0;
  void *in_stack_000001c8;
  FmsIntType in_stack_000001d4;
  void *in_stack_000001d8;
  FmsIntType in_stack_000001e0;
  long alStack_a0 [3];
  long local_88;
  int *local_80;
  FmsInt i;
  unsigned_long __vla_expr0;
  int *local_68;
  int *perm;
  FmsInt num_sides;
  size_t sizeof_side_ids;
  void *pvStack_48;
  FmsIntType side_ids_type;
  void *src_ents;
  void *ents_local;
  FmsInt first_ent_local;
  int **ppiStack_28;
  FmsIntType ent_id_type_local;
  int **reordering_local;
  FmsDomain pFStack_18;
  FmsEntityType type_local;
  FmsDomain domain_local;
  
  __vla_expr0 = (unsigned_long)&local_88;
  if (domain == (FmsDomain)0x0) {
    domain_local._4_4_ = 1;
  }
  else if ((type == FMS_VERTEX) || (FMS_PYRAMID < type)) {
    domain_local._4_4_ = 2;
  }
  else if (ent_id_type < FMS_NUM_INT_TYPES) {
    if (num_ents == 0) {
      domain_local._4_4_ = 0;
    }
    else if (first_ent < domain->num_entities[type]) {
      if (ents == (void *)0x0) {
        domain_local._4_4_ = 5;
      }
      else if (domain->num_entities[type] < first_ent + num_ents) {
        domain_local._4_4_ = 6;
      }
      else if (domain->entities[type] == (void *)0x0) {
        domain_local._4_4_ = 7;
      }
      else {
        sizeof_side_ids._4_4_ = domain->side_ids_type[type];
        num_sides = FmsIntTypeSize[sizeof_side_ids._4_4_];
        i = FmsEntityNumSides[type];
        pvStack_48 = (void *)((long)domain->entities[type] + first_ent * i * num_sides);
        perm = (int *)i;
        src_ents = ents;
        ents_local = (void *)first_ent;
        first_ent_local._4_4_ = ent_id_type;
        ppiStack_28 = reordering;
        reordering_local._4_4_ = type;
        pFStack_18 = domain;
        if ((reordering == (int **)0x0) || (reordering[type] == (int *)0x0)) {
          alStack_a0[2] = 0x11432f;
          FmsIntConvertCopy(in_stack_000001e0,in_stack_000001d8,in_stack_000001d4,in_stack_000001c8,
                            in_stack_000001c0);
        }
        else {
          local_68 = reordering[type];
          lVar1 = -(i * 4 + 0xf & 0xfffffffffffffff0);
          local_88 = (long)&local_88 + lVar1;
          for (local_80 = (int *)0x0; local_80 < i; local_80 = (int *)((long)local_80 + 1)) {
            *(int *)(local_88 + (long)local_68[(long)local_80] * 4) = (int)local_80;
          }
          *(FmsInt *)((long)alStack_a0 + lVar1 + 8) = num_ents * i;
          *(undefined8 *)((long)alStack_a0 + lVar1) = 0x1143d0;
          FmsIntPermuteConvertCopy
                    (*(FmsIntType *)(&stack0x000007e0 + lVar1),*(void **)(&stack0x000007d8 + lVar1),
                     *(FmsIntType *)(&stack0x000007d4 + lVar1),*(void **)(&stack0x000007c8 + lVar1),
                     *(int **)(&stack0x000007c0 + lVar1),*(FmsInt *)(&stack0x000007b8 + lVar1),
                     *(FmsInt *)(&stack0x000007f0 + lVar1));
        }
        domain_local._4_4_ = 0;
      }
    }
    else {
      domain_local._4_4_ = 4;
    }
  }
  else {
    domain_local._4_4_ = 3;
  }
  return domain_local._4_4_;
}

Assistant:

int FmsDomainGetEntities(FmsDomain domain, FmsEntityType type,
                         FmsEntityReordering reordering, FmsIntType ent_id_type,
                         FmsInt first_ent, void *ents, FmsInt num_ents) {
  if (!domain) { E_RETURN(1); }
  if (type == FMS_VERTEX || type >= FMS_NUM_ENTITY_TYPES) { E_RETURN(2); }
  if (ent_id_type >= FMS_NUM_INT_TYPES) { E_RETURN(3); }
  if (num_ents == 0) { return 0; }
  if (first_ent >= domain->num_entities[type]) { E_RETURN(4); }
  if (!ents) { E_RETURN(5); }
  if (first_ent + num_ents > domain->num_entities[type]) { E_RETURN(6); }
  void *src_ents = domain->entities[type];
  if (!src_ents) { E_RETURN(7); }
  const FmsIntType side_ids_type = domain->side_ids_type[type];
  const size_t sizeof_side_ids = FmsIntTypeSize[side_ids_type];
  const FmsInt num_sides = FmsEntityNumSides[type];
  src_ents = (char*)src_ents + first_ent*num_sides*sizeof_side_ids;
  if (reordering == NULL || reordering[type] == NULL) {
    FmsIntConvertCopy(side_ids_type, src_ents, ent_id_type, ents,
                      num_ents*num_sides);
  } else {
    const int *perm = reordering[type];
    int inv_perm[num_sides]; // variable length array
    for (FmsInt i = 0; i < num_sides; i++) {
      inv_perm[perm[i]] = i;
    }
    FmsIntPermuteConvertCopy(side_ids_type, src_ents, ent_id_type, ents,
                             inv_perm, num_sides, num_ents*num_sides);
  }
  return 0;
}